

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,int *nonz,int n)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  undefined8 uVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  type_conflict5 tVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  int *piVar17;
  long lVar18;
  pointer pnVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_200;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  int *local_178;
  cpp_dec_float<50U,_int,_void> *local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  int *local_130;
  int *local_128;
  pointer local_120;
  int *local_118;
  int *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  long local_100;
  long local_f8;
  long local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_1f8.fpclass = cpp_dec_float_finite;
  local_1f8.prec_elem = 10;
  local_1f8.data._M_elems[0] = 0;
  local_1f8.data._M_elems[1] = 0;
  local_1f8.data._M_elems[2] = 0;
  local_1f8.data._M_elems[3] = 0;
  local_1f8.data._M_elems[4] = 0;
  local_1f8.data._M_elems[5] = 0;
  local_1f8.data._M_elems._24_5_ = 0;
  local_1f8.data._M_elems[7]._1_3_ = 0;
  local_1f8.data._M_elems._32_5_ = 0;
  local_1f8.data._M_elems[9]._1_3_ = 0;
  local_1f8.exp = 0;
  local_1f8.neg = false;
  local_118 = (this->l).start;
  local_f8 = (long)(this->l).firstUpdate;
  piVar15 = (this->l).row;
  piVar17 = (this->l).idx;
  lVar18 = (long)(this->l).firstUnused;
  pnVar19 = (this->l).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_200 = n;
  local_110 = nonz;
  local_108 = eps;
  while (lVar13 = lVar18, local_f8 < lVar13) {
    iVar12 = piVar15[lVar13 + -1];
    lVar18 = lVar13 + -1;
    local_168.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar12].m_backend.data._M_elems + 8);
    local_168.data._M_elems._0_8_ = *(undefined8 *)vec[iVar12].m_backend.data._M_elems;
    local_168.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar12].m_backend.data._M_elems + 2);
    puVar2 = vec[iVar12].m_backend.data._M_elems + 4;
    local_168.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_168.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_168.exp = vec[iVar12].m_backend.exp;
    local_168.neg = vec[iVar12].m_backend.neg;
    local_168.fpclass = vec[iVar12].m_backend.fpclass;
    local_168.prec_elem = vec[iVar12].m_backend.prec_elem;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    tVar10 = boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_168,(double *)&local_1b8);
    if (tVar10) {
      local_100 = (long)local_118[lVar18];
      pcVar16 = &pnVar19[local_100].m_backend;
      piVar14 = piVar17 + local_100;
      iVar12 = local_118[lVar13];
      local_130 = piVar15;
      local_128 = piVar17;
      local_120 = pnVar19;
      while( true ) {
        piVar15 = local_130;
        piVar17 = local_128;
        pnVar19 = local_120;
        if (iVar12 <= (int)local_100) break;
        local_f0 = (long)*piVar14;
        pnVar1 = vec + local_f0;
        uVar6 = *(undefined8 *)(vec[local_f0].m_backend.data._M_elems + 8);
        local_1f8.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_1f8.data._M_elems._0_8_ = *(undefined8 *)vec[local_f0].m_backend.data._M_elems;
        local_1f8.data._M_elems._8_8_ = *(undefined8 *)(vec[local_f0].m_backend.data._M_elems + 2);
        puVar2 = vec[local_f0].m_backend.data._M_elems + 4;
        local_1f8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar6 = *(undefined8 *)(puVar2 + 2);
        local_1f8.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_1f8.exp = vec[local_f0].m_backend.exp;
        local_1f8.neg = vec[local_f0].m_backend.neg;
        local_1f8.fpclass = vec[local_f0].m_backend.fpclass;
        local_1f8.prec_elem = vec[local_f0].m_backend.prec_elem;
        local_1b8.data._M_elems._0_8_ = local_1b8.data._M_elems._0_8_ & 0xffffffff00000000;
        local_178 = piVar14;
        local_170 = pcVar16;
        tVar10 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1f8,(int *)&local_1b8);
        pcVar16 = local_170;
        if (tVar10) {
          local_e8.data._M_elems[0] = local_168.data._M_elems[0];
          local_e8.data._M_elems[1] = local_168.data._M_elems[1];
          uVar6 = local_e8.data._M_elems._0_8_;
          local_e8.data._M_elems[2] = local_168.data._M_elems[2];
          local_e8.data._M_elems[3] = local_168.data._M_elems[3];
          local_e8.data._M_elems[8] = local_168.data._M_elems[8];
          local_e8.data._M_elems[9] = local_168.data._M_elems[9];
          local_e8.data._M_elems[4] = local_168.data._M_elems[4];
          local_e8.data._M_elems[5] = local_168.data._M_elems[5];
          local_e8.data._M_elems[6] = local_168.data._M_elems[6];
          local_e8.data._M_elems[7] = local_168.data._M_elems[7];
          local_e8.exp = local_168.exp;
          local_e8.neg = local_168.neg;
          local_e8.fpclass = local_168.fpclass;
          local_e8.prec_elem = local_168.prec_elem;
          local_e8.data._M_elems[0] = local_168.data._M_elems[0];
          if (local_168.fpclass != cpp_dec_float_finite || local_e8.data._M_elems[0] != 0) {
            local_e8.neg = (bool)(local_168.neg ^ 1);
          }
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 10;
          local_1b8.data._M_elems[0] = 0;
          local_1b8.data._M_elems[1] = 0;
          local_1b8.data._M_elems[2] = 0;
          local_1b8.data._M_elems[3] = 0;
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems._24_5_ = 0;
          local_1b8.data._M_elems[7]._1_3_ = 0;
          local_1b8.data._M_elems._32_5_ = 0;
          local_1b8.data._M_elems[9]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          local_e8.data._M_elems._0_8_ = uVar6;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1b8,&local_e8,local_170);
          local_a8.m_backend.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
          local_a8.m_backend.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
          local_1f8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
          local_1f8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
          local_a8.m_backend.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
          local_a8.m_backend.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
          local_1f8.data._M_elems[4] = local_1b8.data._M_elems[4];
          local_1f8.data._M_elems[5] = local_1b8.data._M_elems[5];
          local_1f8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
          local_1f8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
          local_1f8.data._M_elems[0] = local_1b8.data._M_elems[0];
          local_1f8.data._M_elems[1] = local_1b8.data._M_elems[1];
          local_1f8.data._M_elems[2] = local_1b8.data._M_elems[2];
          local_1f8.data._M_elems[3] = local_1b8.data._M_elems[3];
          local_1f8.exp = local_1b8.exp;
          local_1f8.neg = local_1b8.neg;
          local_a8.m_backend.fpclass = local_1b8.fpclass;
          local_a8.m_backend.prec_elem = local_1b8.prec_elem;
          local_1f8.fpclass = local_1b8.fpclass;
          local_1f8.prec_elem = local_1b8.prec_elem;
          local_a8.m_backend.data._M_elems[0] = local_1b8.data._M_elems[0];
          local_a8.m_backend.data._M_elems[1] = local_1b8.data._M_elems[1];
          local_a8.m_backend.data._M_elems[2] = local_1b8.data._M_elems[2];
          local_a8.m_backend.data._M_elems[3] = local_1b8.data._M_elems[3];
          local_a8.m_backend.data._M_elems[4] = local_1b8.data._M_elems[4];
          local_a8.m_backend.data._M_elems[5] = local_1b8.data._M_elems[5];
          local_a8.m_backend.exp = local_1b8.exp;
          local_a8.m_backend.neg = local_1b8.neg;
          local_68.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((local_108->m_backend).data._M_elems + 8);
          local_68.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(local_108->m_backend).data._M_elems;
          local_68.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((local_108->m_backend).data._M_elems + 2);
          local_68.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((local_108->m_backend).data._M_elems + 4);
          local_68.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((local_108->m_backend).data._M_elems + 6);
          local_68.m_backend.exp = (local_108->m_backend).exp;
          local_68.m_backend.neg = (local_108->m_backend).neg;
          local_68.m_backend.fpclass = (local_108->m_backend).fpclass;
          local_68.m_backend.prec_elem = (local_108->m_backend).prec_elem;
          bVar11 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_a8,&local_68);
          if (bVar11) {
            *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                 CONCAT35(local_1f8.data._M_elems[9]._1_3_,local_1f8.data._M_elems._32_5_);
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_1f8.data._M_elems._16_8_;
            *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                 CONCAT35(local_1f8.data._M_elems[7]._1_3_,local_1f8.data._M_elems._24_5_);
            *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1f8.data._M_elems._0_8_;
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_1f8.data._M_elems._8_8_;
            (pnVar1->m_backend).exp = local_1f8.exp;
            (pnVar1->m_backend).neg = local_1f8.neg;
            (pnVar1->m_backend).fpclass = local_1f8.fpclass;
            (pnVar1->m_backend).prec_elem = local_1f8.prec_elem;
            lVar13 = (long)local_200;
            local_200 = local_200 + 1;
            local_110[lVar13] = (int)local_f0;
          }
        }
        else {
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 10;
          local_1b8.data._M_elems[0] = 0;
          local_1b8.data._M_elems[1] = 0;
          local_1b8.data._M_elems[2] = 0;
          local_1b8.data._M_elems[3] = 0;
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems._24_5_ = 0;
          local_1b8.data._M_elems[7]._1_3_ = 0;
          local_1b8.data._M_elems._32_5_ = 0;
          local_1b8.data._M_elems[9]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1b8,&local_168,local_170);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1f8,&local_1b8);
          local_e8.data._M_elems._0_8_ = local_e8.data._M_elems._0_8_ & 0xffffffff00000000;
          tVar10 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1f8,(int *)&local_e8);
          if (tVar10) {
            local_1b8.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
            local_1b8.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
            local_1b8.data._M_elems[4] = local_1f8.data._M_elems[4];
            local_1b8.data._M_elems[5] = local_1f8.data._M_elems[5];
            local_1b8.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
            local_1b8.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
            local_1b8.data._M_elems[0] = local_1f8.data._M_elems[0];
            local_1b8.data._M_elems[1] = local_1f8.data._M_elems[1];
            local_1b8.data._M_elems[2] = local_1f8.data._M_elems[2];
            local_1b8.data._M_elems[3] = local_1f8.data._M_elems[3];
            pcVar16 = &local_1f8;
            pcVar7 = &local_1f8;
            pcVar8 = &local_1f8;
            pcVar9 = &local_1f8;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_1b8,1e-100,(type *)0x0);
            pcVar16 = &local_1b8;
            pcVar7 = &local_1b8;
            pcVar8 = &local_1b8;
            pcVar9 = &local_1b8;
          }
          iVar3 = pcVar16->exp;
          bVar11 = pcVar7->neg;
          fVar4 = pcVar8->fpclass;
          iVar5 = pcVar9->prec_elem;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
               CONCAT35(local_1b8.data._M_elems[9]._1_3_,local_1b8.data._M_elems._32_5_);
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_1b8.data._M_elems._16_8_;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
               CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
          *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_;
          (pnVar1->m_backend).exp = iVar3;
          (pnVar1->m_backend).neg = bVar11;
          (pnVar1->m_backend).fpclass = fVar4;
          (pnVar1->m_backend).prec_elem = iVar5;
          pcVar16 = local_170;
        }
        piVar14 = local_178 + 1;
        pcVar16 = pcVar16 + 1;
        iVar12 = iVar12 + -1;
      }
    }
  }
  return local_200;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}